

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.h
# Opt level: O2

unsigned_long
Assimp::FBX::PropertyGet<unsigned_long>(PropertyTable *in,string *name,unsigned_long *defaultValue)

{
  Property *this;
  TypedProperty<unsigned_long> *pTVar1;
  
  this = PropertyTable::Get(in,name);
  if (this != (Property *)0x0) {
    pTVar1 = Property::As<Assimp::FBX::TypedProperty<unsigned_long>>(this);
    if (pTVar1 != (TypedProperty<unsigned_long> *)0x0) {
      defaultValue = &pTVar1->value;
    }
  }
  return *defaultValue;
}

Assistant:

inline 
T PropertyGet(const PropertyTable& in, const std::string& name, const T& defaultValue) {
    const Property* const prop = in.Get(name);
    if( nullptr == prop) {
        return defaultValue;
    }

    // strong typing, no need to be lenient
    const TypedProperty<T>* const tprop = prop->As< TypedProperty<T> >();
    if( nullptr == tprop) {
        return defaultValue;
    }

    return tprop->Value();
}